

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlParserInputGrow(xmlParserInputPtr in,int len)

{
  xmlChar *pxVar1;
  size_t sVar2;
  xmlChar *pxVar3;
  xmlChar *content;
  size_t indx;
  int ret;
  int len_local;
  xmlParserInputPtr in_local;
  
  if ((in == (xmlParserInputPtr)0x0) || (len < 0)) {
    in_local._4_4_ = -1;
  }
  else if (in->buf == (xmlParserInputBufferPtr)0x0) {
    in_local._4_4_ = -1;
  }
  else if (in->base == (xmlChar *)0x0) {
    in_local._4_4_ = -1;
  }
  else if (in->cur == (xmlChar *)0x0) {
    in_local._4_4_ = -1;
  }
  else if (in->buf->buffer == (xmlBufPtr)0x0) {
    in_local._4_4_ = -1;
  }
  else {
    pxVar3 = in->cur;
    pxVar1 = in->base;
    sVar2 = xmlBufUse(in->buf->buffer);
    if (((int)pxVar3 - (int)pxVar1) + 0xfa < sVar2) {
      in_local._4_4_ = 0;
    }
    else if (in->buf->readcallback == (xmlInputReadCallback)0x0) {
      in_local._4_4_ = 0;
    }
    else {
      in_local._4_4_ = xmlParserInputBufferGrow(in->buf,len);
      pxVar3 = xmlBufContent(in->buf->buffer);
      if (in->base != pxVar3) {
        pxVar1 = in->base;
        in->base = pxVar3;
        in->cur = pxVar3 + ((long)in->cur - (long)pxVar1);
      }
      pxVar3 = xmlBufEnd(in->buf->buffer);
      in->end = pxVar3;
    }
  }
  return in_local._4_4_;
}

Assistant:

int
xmlParserInputGrow(xmlParserInputPtr in, int len) {
    int ret;
    size_t indx;
    const xmlChar *content;

    if ((in == NULL) || (len < 0)) return(-1);
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext, "Grow\n");
#endif
    if (in->buf == NULL) return(-1);
    if (in->base == NULL) return(-1);
    if (in->cur == NULL) return(-1);
    if (in->buf->buffer == NULL) return(-1);

    CHECK_BUFFER(in);

    indx = in->cur - in->base;
    if (xmlBufUse(in->buf->buffer) > (unsigned int) indx + INPUT_CHUNK) {

	CHECK_BUFFER(in);

        return(0);
    }
    if (in->buf->readcallback != NULL) {
	ret = xmlParserInputBufferGrow(in->buf, len);
    } else
        return(0);

    /*
     * NOTE : in->base may be a "dangling" i.e. freed pointer in this
     *        block, but we use it really as an integer to do some
     *        pointer arithmetic. Insure will raise it as a bug but in
     *        that specific case, that's not !
     */

    content = xmlBufContent(in->buf->buffer);
    if (in->base != content) {
        /*
	 * the buffer has been reallocated
	 */
	indx = in->cur - in->base;
	in->base = content;
	in->cur = &content[indx];
    }
    in->end = xmlBufEnd(in->buf->buffer);

    CHECK_BUFFER(in);

    return(ret);
}